

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_irreg_distr64(int g_a,int64_t *map,int64_t *block)

{
  Integer IVar1;
  Integer *mapc;
  long lVar2;
  long lVar3;
  int64_t *piVar4;
  Integer _ga_work [7];
  Integer aIStack_58 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  lVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  piVar4 = aIStack_58 + IVar1;
  for (; piVar4 = piVar4 + -1, lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *piVar4 = block[lVar2];
  }
  mapc = copy_map64(block,(int)IVar1,map);
  pnga_set_irreg_distr((long)g_a,mapc,aIStack_58);
  free(mapc);
  return;
}

Assistant:

void NGA_Set_irreg_distr64(int g_a, int64_t map[], int64_t block[])
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map64(block, (int)ndim, map);

    wnga_set_irreg_distr(aa, _ga_map_capi, _ga_work);
    free(_ga_map_capi);
}